

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O0

Vec3<float> Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(Rand48 *rand)

{
  uint uVar1;
  float *pfVar2;
  Vec3<float> *in_RDI;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  Vec3<float> VVar4;
  uint i;
  Vec3<float> *v;
  float in_stack_ffffffffffffffd0;
  uint uVar5;
  Vec3<float> *this;
  undefined4 local_14;
  
  this = in_RDI;
  Vec3<float>::Vec3(in_RDI);
  do {
    local_14 = 0;
    while( true ) {
      uVar5 = local_14;
      uVar1 = Vec3<float>::dimensions();
      if (uVar1 <= uVar5) break;
      dVar3 = Rand48::nextf((Rand48 *)this,(double)in_RDI,
                            (double)CONCAT44(uVar5,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd0 = (float)dVar3;
      pfVar2 = Vec3<float>::operator[](in_RDI,local_14);
      *pfVar2 = in_stack_ffffffffffffffd0;
      local_14 = local_14 + 1;
    }
    VVar4.x = Vec3<float>::length2((Vec3<float> *)0x146634);
    VVar4.y = (float)extraout_XMM0_Db;
  } while (1.0 < VVar4.x);
  VVar4.z = 1.0;
  return VVar4;
}

Assistant:

Vec
solidSphereRand (Rand &rand)
{
    Vec v;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);
    }
    while (v.length2() > 1);

    return v;
}